

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

void printUnsignedImm(MCInst *MI,int opNum,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  MCOperand *op;
  ulong uVar3;
  uint8_t *puVar4;
  int64_t imm;
  MCOperand *MO;
  SStream *O_local;
  int opNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,opNum);
  _Var2 = MCOperand_isImm(op);
  if (_Var2) {
    uVar3 = MCOperand_getImm(op);
    if ((long)uVar3 < 0) {
      if ((long)uVar3 < -9) {
        SStream_concat(O,"-0x%x",(ulong)(uint)(int)(short)-(short)uVar3);
      }
      else {
        SStream_concat(O,"-%u",(ulong)(uint)(int)(short)-(short)uVar3);
      }
    }
    else if ((long)uVar3 < 10) {
      SStream_concat(O,"%u",uVar3 & 0xffff);
    }
    else {
      SStream_concat(O,"0x%x",uVar3 & 0xffff);
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar4 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x18 + 0x16;
      puVar4[0] = '\x02';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\0';
      *(ulong *)(MI->flat_insn->detail->groups +
                (ulong)(MI->flat_insn->detail->field_6).x86.prefix[0] * 0x18 + 0x1e) =
           uVar3 & 0xffff;
      pcVar1 = MI->flat_insn->detail;
      (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + '\x01';
    }
  }
  else {
    printOperand(MI,opNum,O);
  }
  return;
}

Assistant:

static void printUnsignedImm(MCInst *MI, int opNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, opNum);
	if (MCOperand_isImm(MO)) {
		int64_t imm = MCOperand_getImm(MO);
		if (imm >= 0) {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", (unsigned short int)imm);
			else
				SStream_concat(O, "%u", (unsigned short int)imm);
		} else {
			if (imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", (short int)-imm);
			else
				SStream_concat(O, "-%u", (short int)-imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_IMM;
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].imm = (unsigned short int)imm;
			MI->flat_insn->detail->mips.op_count++;
		}
	} else
		printOperand(MI, opNum, O);
}